

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O3

char * rapidjson::internal::Prettify(char *buffer,int length,int k,int maxDecimalPlaces)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = k + length;
  if ((int)uVar3 < 0x16 && -1 < k) {
    if (k != 0) {
      uVar2 = length + 1U;
      if ((int)(length + 1U) < (int)uVar3) {
        uVar2 = uVar3;
      }
      memset(buffer + length,0x30,(ulong)(~length + uVar2) + 1);
    }
    pcVar1 = buffer + (int)uVar3;
    pcVar1[0] = '.';
    pcVar1[1] = '0';
    return pcVar1 + 2;
  }
  uVar2 = uVar3 - 1;
  if (uVar2 < 0x15) {
    memmove(buffer + (ulong)uVar3 + 1,buffer + uVar3,(long)-k);
    (buffer + (ulong)uVar3 + 1)[-1] = '.';
    if (-1 < k + maxDecimalPlaces) {
      return buffer + (long)length + 1;
    }
    if (1 < maxDecimalPlaces) {
      uVar2 = maxDecimalPlaces + uVar3;
      pcVar1 = buffer + (long)(int)uVar2 + 1;
      do {
        if (buffer[uVar2] != '0') {
          return pcVar1;
        }
        uVar2 = uVar2 - 1;
        pcVar1 = pcVar1 + -1;
      } while ((int)(uVar3 + 1) < (int)uVar2);
    }
    return buffer + uVar3 + 2;
  }
  if (uVar3 + 5 < 6) {
    uVar2 = 2 - uVar3;
    memmove(buffer + uVar2,buffer,(long)length);
    buffer[0] = '0';
    buffer[1] = '.';
    if ((int)uVar3 < 0) {
      uVar3 = 3;
      if (3 < uVar2) {
        uVar3 = uVar2;
      }
      memset(buffer + 2,0x30,(ulong)(uVar3 - 2));
    }
    if (-k <= maxDecimalPlaces) {
      return buffer + (int)(uVar2 + length);
    }
    if (1 < maxDecimalPlaces) {
      uVar4 = (ulong)(maxDecimalPlaces + 2);
      do {
        uVar3 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar3;
        if (buffer[uVar4] != '0') {
          return buffer + uVar4 + 1;
        }
      } while (3 < (int)uVar3);
    }
    goto LAB_00145770;
  }
  if (SBORROW4(uVar3,-maxDecimalPlaces) != (int)(uVar3 + maxDecimalPlaces) < 0) {
    buffer[0] = '0';
    buffer[1] = '.';
    buffer[2] = '0';
    goto LAB_00145770;
  }
  if (length == 1) {
    buffer[1] = 'e';
    if ((int)uVar2 < 0) {
LAB_0014572f:
      buffer[2] = '-';
      buffer = buffer + 3;
      uVar2 = 1 - uVar3;
    }
    else {
      buffer = buffer + 2;
    }
  }
  else {
    memmove(buffer + 2,buffer + 1,(long)(length + -1));
    buffer[1] = '.';
    buffer[(long)length + 1] = 'e';
    if ((int)uVar2 < 0) {
      buffer = buffer + length;
      goto LAB_0014572f;
    }
    buffer = buffer + (long)length + 2;
  }
  if (uVar2 < 100) {
    if (9 < uVar2) {
      *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)uVar2 * 2);
      return (char *)((byte *)buffer + 2);
    }
    *buffer = (byte)uVar2 | 0x30;
    return (char *)((byte *)buffer + 1);
  }
  *buffer = (char)(uVar2 / 100) + 0x30;
  *(undefined2 *)((byte *)buffer + 1) =
       *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar2 % 100) * 2);
LAB_00145770:
  return (char *)((byte *)buffer + 3);
}

Assistant:

inline char* Prettify(char* buffer, int length, int k, int maxDecimalPlaces) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (0 <= k && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], static_cast<size_t>(length - kk));
        buffer[kk] = '.';
        if (0 > k + maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 1.2345 -> 1.23, 1.102 -> 1.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = kk + maxDecimalPlaces; i > kk + 1; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[kk + 2]; // Reserve one zero
        }
        else
            return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], static_cast<size_t>(length));
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        if (length - kk > maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 0.123 -> 0.12, 0.102 -> 0.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = maxDecimalPlaces + 1; i > 2; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[3]; // Reserve one zero
        }
        else
            return &buffer[length + offset];
    }
    else if (kk < -maxDecimalPlaces) {
        // Truncate to zero
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], static_cast<size_t>(length - 1));
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}